

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

void convolve_Gaussian(uchar (*inpic) [512] [512],float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],float sigma,int pic_t,int pic_x,int pic_y,int start,
                      int frame,int time)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  float (*pafVar6) [512];
  ulong uVar7;
  float *pfVar8;
  uchar (*pauVar9) [512];
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uchar (*pauVar15) [512];
  float fVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  float mask [100];
  float local_1c8 [102];
  
  if (OUTPUT_SMOOTH != 0) {
    puts("\nStart of 3D convolution");
    printf("Time: %d Frame: %d\n",(ulong)(uint)time,(ulong)(uint)frame);
  }
  fflush(_stdout);
  uVar4 = (uint)(sigma * 6.0 + 1.0);
  uVar5 = uVar4 | 1;
  if (pic_t < (int)uVar5) {
    puts("\nFatal error: not enough images");
    exit(1);
  }
  uVar1 = (int)(uVar5 - ((int)uVar4 >> 0x1f)) >> 1;
  if ((sigma != 0.0) || (NAN(sigma))) {
    if ((int)uVar4 < 0) {
      dVar17 = 0.0;
    }
    else {
      dVar17 = (double)sigma;
      fVar19 = 0.0;
      uVar11 = 0;
      do {
        iVar2 = (int)uVar11 - uVar1;
        dVar18 = exp((double)-(iVar2 * iVar2) / ((dVar17 + dVar17) * dVar17));
        fVar16 = (float)(dVar18 * (1.0 / (dVar17 * 2.5066282746310002)));
        local_1c8[uVar11] = fVar16;
        fVar19 = fVar19 + fVar16;
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
      dVar17 = (double)fVar19;
    }
  }
  else {
    local_1c8[0] = 1.0;
    dVar17 = 1.0;
  }
  if (OUTPUT_SMOOTH != 0) {
    printf("Size: %d Offset: %d\nMask values: ",(ulong)uVar5,(ulong)uVar1);
    if (-1 < (int)uVar4) {
      uVar11 = 0;
      do {
        printf("%f ",(double)local_1c8[uVar11]);
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    printf("\nSum of mask values: %f\n",dVar17);
  }
  if (0 < pic_x) {
    lVar12 = 0;
    do {
      if (0 < pic_y) {
        memset((void *)((long)pic1[0] + lVar12),0,(ulong)(uint)pic_y << 2);
        memset((void *)((long)pic0[0] + lVar12),0,(ulong)(uint)pic_y << 2);
      }
      lVar12 = lVar12 + 0x800;
    } while ((ulong)(uint)pic_x << 0xb != lVar12);
  }
  if ((sigma != 0.0) || (NAN(sigma))) {
    if (0 < pic_x) {
      uVar4 = -uVar1;
      if (uVar1 != uVar4 && SBORROW4(uVar1,uVar4) == (int)(uVar1 * 2) < 0) {
        uVar4 = uVar1;
      }
      uVar11 = 0;
      do {
        if (0 < pic_y) {
          uVar7 = 0;
          do {
            fVar19 = 0.0;
            if (-2 < (int)uVar5) {
              lVar12 = 0;
              do {
                fVar19 = fVar19 + (float)inpic[(int)((int)lVar12 + ((frame - uVar1) - start))]
                                         [uVar11][uVar7] * local_1c8[lVar12];
                lVar12 = lVar12 + 1;
              } while (uVar4 + uVar1 + 1 != (int)lVar12);
            }
            pic0[uVar11][uVar7] = fVar19;
            uVar7 = uVar7 + 1;
          } while (uVar7 != (uint)pic_y);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uint)pic_x);
    }
    if (OUTPUT_SMOOTH != 0) {
      puts("Convolution in t direction completed");
    }
    iVar2 = pic_x - uVar1;
    if ((int)uVar1 < iVar2) {
      uVar4 = -uVar1;
      lVar12 = (long)(int)uVar1;
      if (uVar1 != uVar4 && SBORROW4(uVar1,uVar4) == (int)(uVar1 * 2) < 0) {
        uVar4 = uVar1;
      }
      pafVar6 = pic0;
      do {
        if (0 < pic_y) {
          uVar11 = 0;
          pfVar3 = *pafVar6;
          do {
            fVar19 = 0.0;
            if (-2 < (int)uVar5) {
              lVar13 = 0;
              pfVar8 = pfVar3;
              do {
                fVar19 = fVar19 + *pfVar8 * local_1c8[lVar13];
                lVar13 = lVar13 + 1;
                pfVar8 = pfVar8 + 0x200;
              } while (uVar4 + uVar1 + 1 != (int)lVar13);
            }
            pic1[lVar12][uVar11] = fVar19;
            uVar11 = uVar11 + 1;
            pfVar3 = pfVar3 + 1;
          } while (uVar11 != (uint)pic_y);
        }
        lVar12 = lVar12 + 1;
        pafVar6 = (float (*) [512])((long)pafVar6 + 0x800);
      } while (lVar12 != iVar2);
    }
    if (OUTPUT_SMOOTH != 0) {
      puts("Convolution in x direction completed");
    }
    if ((int)uVar1 < iVar2) {
      lVar12 = (long)(int)uVar1;
      uVar4 = -uVar1;
      pfVar3 = pic1[lVar12];
      if (uVar1 != uVar4 && SBORROW4(uVar1,uVar4) == (int)(uVar1 * 2) < 0) {
        uVar4 = uVar1;
      }
      lVar13 = lVar12;
      do {
        pfVar8 = pfVar3;
        lVar10 = lVar12;
        if ((int)uVar1 < (int)(pic_y - uVar1)) {
          do {
            fVar19 = 0.0;
            if (-2 < (int)uVar5) {
              lVar14 = 0;
              do {
                fVar19 = fVar19 + pfVar8[lVar14] * local_1c8[lVar14];
                lVar14 = lVar14 + 1;
              } while (uVar4 + uVar1 + 1 != (int)lVar14);
            }
            fVar16 = 255.0;
            if (fVar19 <= 255.0) {
              fVar16 = fVar19;
            }
            fVar19 = 0.0;
            if (0.0 <= fVar16) {
              fVar19 = fVar16;
            }
            floatpic[time][lVar13][lVar10] = fVar19;
            pic[time][lVar13][lVar10] = (uchar)(int)(fVar19 + 0.5);
            lVar10 = lVar10 + 1;
            pfVar8 = pfVar8 + 1;
          } while (lVar10 != (int)(pic_y - uVar1));
        }
        lVar13 = lVar13 + 1;
        pfVar3 = pfVar3 + 0x200;
      } while (lVar13 != iVar2);
    }
    if (OUTPUT_SMOOTH != 0) {
      puts("Convolution in y direction completed");
    }
  }
  else if (0 < pic_x) {
    pauVar15 = inpic[(long)frame - (long)start];
    pauVar9 = pic[time];
    uVar11 = 0;
    do {
      if (0 < pic_y) {
        uVar7 = 0;
        do {
          (*(uchar (*) [512])*pauVar9)[uVar7] = (*(uchar (*) [512])*pauVar15)[uVar7];
          uVar7 = uVar7 + 1;
        } while ((uint)pic_y != uVar7);
      }
      uVar11 = uVar11 + 1;
      pauVar15 = pauVar15 + 1;
      pauVar9 = pauVar9 + 1;
    } while (uVar11 != (uint)pic_x);
  }
  if (OUTPUT_SMOOTH != 0) {
    puts("End of Convolution");
  }
  fflush(_stdout);
  return;
}

Assistant:

void convolve_Gaussian(
unsigned char inpic[PIC_T][PIC_X][PIC_Y],
float floatpic[FIVE][PIC_X][PIC_Y],
unsigned char pic[FIVE][PIC_X][PIC_Y],
float sigma, int pic_t, int pic_x, int pic_y,
int start, int frame, int time)
{
float mask[100],term,sum;
int size,i,j,offset,a,b;


if(OUTPUT_SMOOTH)
{
printf("\nStart of 3D convolution\n");
printf("Time: %d Frame: %d\n",time,frame);
}

fflush(stdout);
size = (int) (6*sigma+1);
if(size%2==0) size = size+1;
offset = size/2;
if(pic_t < size)
	{
	printf("\nFatal error: not enough images\n");
	exit(1);
	}
sum = 0.0;

if(sigma != 0.0)
for(i=0;i<size;i++)
	{
	mask[i] = (1.0/(sqrt(2.0*M_PI)*sigma))*
		exp(-(i-offset)*(i-offset)/(2.0*sigma*sigma));
	sum = sum+mask[i];
	}
else { mask[0] = 1.0; sum = 1.0; }

if(OUTPUT_SMOOTH)
{
printf("Size: %d Offset: %d\nMask values: ",size,offset);
for(i=0;i<size;i++)
	printf("%f ",mask[i]);
printf("\nSum of mask values: %f\n",sum);
}
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic0[i][j] = pic1[i][j] = 0.0;


if(sigma != 0.0)
{
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term +(inpic[a+frame-start][i][j]*mask[a+offset]);
		}
	pic0[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in t direction completed\n");
for(i=offset;i<pic_x-offset;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term + (pic0[i+a][j]*mask[a+offset]);
		}
	pic1[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in x direction completed\n");

for(i=offset;i<pic_x-offset;i++)
for(j=offset;j<pic_y-offset;j++)
	{
	term = 0.0;
	for(b=-offset;b<=offset;b++)
		{
		term = term + (pic1[i][j+b])*mask[b+offset];
		}
	if(term > 255.0) term = 255.0;
	if(term < 0.0) term = 0.0;
	floatpic[time][i][j] = term;
	pic[time][i][j] = (int) (term+0.5);
	}
if(OUTPUT_SMOOTH) printf("Convolution in y direction completed\n");
}
else /* No smoothing */
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic[time][i][j] = inpic[frame-start][i][j];

if(OUTPUT_SMOOTH) printf("End of Convolution\n");
fflush(stdout);
}